

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O1

void chapter3::display_families
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *families,ostream *os)

{
  _Base_ptr p_Var1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  
  for (p_Var3 = (families->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(families->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"The ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," family ",8);
    if (*(_Base_ptr *)(p_Var3 + 2) == p_Var3[2]._M_parent) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"has no children.\n",0x11);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"has ",4);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," children: ",0xb);
      p_Var1 = p_Var3[2]._M_parent;
      for (p_Var4 = *(_Base_ptr *)(p_Var3 + 2); p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)p_Var4,(long)p_Var4->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void chapter3::display_families(map<string, vector<string>> &families, ostream &os) {
    map<string, vector<string>>::const_iterator
            iter = families.begin(),
            end_iter = families.end();

    while (iter != end_iter) {
        os << "The " << iter->first << " family ";
        if (iter->second.empty()) {
            os << "has no children.\n";
        } else {
            os << "has " << iter->second.size() << " children: ";
            vector<string>::const_iterator viter = iter->second.begin(), vend_iter = iter->second.end();

            while (viter != vend_iter) {
                os << *viter << " ";
                ++viter;
            }
            os << endl;
        }

        ++iter;
    }
}